

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::
PrintSerializedPbInterval<google::protobuf::DescriptorProto>
          (Generator *this,DescriptorProto *descriptor_proto,string_view name)

{
  Printer *this_00;
  uint64_t i;
  Nonnull<char_*> pcVar1;
  string_view text;
  string sp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string_view name_local;
  char local_80 [32];
  long local_60;
  Nonnull<char_*> local_58;
  char local_50 [32];
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  sp._M_string_length = 0;
  sp.field_2._M_local_buf[0] = '\0';
  sp._M_dataplus._M_p = (pointer)&sp.field_2;
  MessageLite::SerializeToString((MessageLite *)descriptor_proto,&sp);
  i = std::__cxx11::string::find
                ((char *)&this->file_descriptor_serialized_,(ulong)sp._M_dataplus._M_p,0);
  this_00 = this->printer_;
  pcVar1 = absl::lts_20250127::numbers_internal::FastIntToBuffer(i,local_50);
  local_60 = (long)pcVar1 - (long)local_50;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_58 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,local_50,pcVar1);
  pcVar1 = absl::lts_20250127::numbers_internal::FastIntToBuffer(i + sp._M_string_length,local_80);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,local_80,pcVar1);
  text._M_str = 
  "_globals[\'$name$\']._serialized_start=$serialized_start$\n_globals[\'$name$\']._serialized_end=$serialized_end$\n"
  ;
  text._M_len = 0x6c;
  io::Printer::
  Print<char[5],std::basic_string_view<char,std::char_traits<char>>,char[17],std::__cxx11::string,char[15],std::__cxx11::string>
            (this_00,text,(char (*) [5])0x7203be,&name_local,(char (*) [17])"serialized_start",
             &local_e0,(char (*) [15])"serialized_end",&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sp._M_dataplus._M_p != &sp.field_2) {
    operator_delete(sp._M_dataplus._M_p,
                    CONCAT71(sp.field_2._M_allocated_capacity._1_7_,sp.field_2._M_local_buf[0]) + 1)
    ;
  }
  return;
}

Assistant:

void Generator::PrintSerializedPbInterval(
    const DescriptorProtoT& descriptor_proto, absl::string_view name) const {
  std::string sp;
  descriptor_proto.SerializeToString(&sp);
  size_t offset = file_descriptor_serialized_.find(sp);
  ABSL_CHECK_GE(offset, 0);

  printer_->Print(
      "_globals['$name$']._serialized_start=$serialized_start$\n"
      "_globals['$name$']._serialized_end=$serialized_end$\n",
      "name", name, "serialized_start", absl::StrCat(offset), "serialized_end",
      absl::StrCat(offset + sp.size()));
}